

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int tool_mime_stdin_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  tool_mime *sip;
  curl_off_t cStack_20;
  int whence_local;
  curl_off_t offset_local;
  void *instream_local;
  
  if (whence == 1) {
    cStack_20 = *(long *)((long)instream + 0x60) + offset;
  }
  else {
    cStack_20 = offset;
    if (whence == 2) {
      cStack_20 = *(long *)((long)instream + 0x58) + offset;
    }
  }
  if (cStack_20 < 0) {
    instream_local._4_4_ = 2;
  }
  else if ((*(long *)((long)instream + 0x18) == 0) &&
          (iVar1 = fseek(_stdin,cStack_20 + *(long *)((long)instream + 0x50),0), iVar1 != 0)) {
    instream_local._4_4_ = 2;
  }
  else {
    *(curl_off_t *)((long)instream + 0x60) = cStack_20;
    instream_local._4_4_ = 0;
  }
  return instream_local._4_4_;
}

Assistant:

int tool_mime_stdin_seek(void *instream, curl_off_t offset, int whence)
{
  struct tool_mime *sip = (struct tool_mime *) instream;

  switch(whence) {
  case SEEK_CUR:
    offset += sip->curpos;
    break;
  case SEEK_END:
    offset += sip->size;
    break;
  }
  if(offset < 0)
    return CURL_SEEKFUNC_CANTSEEK;
  if(!sip->data) {
    if(fseek(stdin, (long) (offset + sip->origin), SEEK_SET))
      return CURL_SEEKFUNC_CANTSEEK;
  }
  sip->curpos = offset;
  return CURL_SEEKFUNC_OK;
}